

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::setMinimumSignificantDigits(DecimalFormat *this,int32_t value)

{
  DecimalFormatProperties *pDVar1;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->minimumSignificantDigits == value) {
    return;
  }
  if (pDVar1->maximumSignificantDigits < value && -1 < pDVar1->maximumSignificantDigits) {
    pDVar1->maximumSignificantDigits = value;
  }
  pDVar1->minimumSignificantDigits = value;
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setMinimumSignificantDigits(int32_t value) {
    if (value == fields->properties->minimumSignificantDigits) { return; }
    int32_t max = fields->properties->maximumSignificantDigits;
    if (max >= 0 && max < value) {
        fields->properties->maximumSignificantDigits = value;
    }
    fields->properties->minimumSignificantDigits = value;
    touchNoError();
}